

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O3

bool Js::VarIs<Js::BoundFunction,Js::JavascriptFunction>(JavascriptFunction *obj)

{
  bool bVar1;
  int iVar2;
  JavascriptFunction *pJVar3;
  
  bVar1 = VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)obj);
  if (bVar1) {
    pJVar3 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>((RecyclableObject *)obj);
    iVar2 = (*(pJVar3->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pJVar3);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool VarIs(U* obj)
    {
        // ChakraFull can't include type_traits, but ChakraCore does include it for debug builds
#if DBG && !defined(NTBUILD)
        static_assert(!std::is_same<T, U>::value, "Check should be unnecessary - did you prematurely cast?");
        static_assert(std::is_base_of<U, T>::value, "VarIs/VarTo should only downcast!");
#endif
        return VarIsImpl<T>(obj);
    }